

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>::add
          (array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_> *this,CSkinPart *item)

{
  int iVar1;
  long lVar2;
  CSkinPart *pCVar3;
  byte bVar4;
  
  bVar4 = 0;
  incsize(this);
  iVar1 = this->num_elements;
  if (this->list_size <= iVar1) {
    alloc(this,iVar1 + 1);
  }
  this->num_elements = iVar1 + 1;
  pCVar3 = this->list + iVar1;
  for (lVar2 = 0x1f; lVar2 != 0; lVar2 = lVar2 + -1) {
    pCVar3->m_Flags = item->m_Flags;
    item = (CSkinPart *)((long)item + (ulong)bVar4 * -8 + 4);
    pCVar3 = (CSkinPart *)((long)pCVar3 + ((ulong)bVar4 * -2 + 1) * 4);
  }
  return this->num_elements + -1;
}

Assistant:

int add(const T& item)
	{
		incsize();
		set_size(size()+1);
		list[num_elements-1] = item;
		return num_elements-1;
	}